

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::IntLoadConstraint_C
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp
          ,double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  Scalar *pSVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_60;
  undefined1 local_48 [40];
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    local_60 = c * this->m_cur_par1;
    if (do_clamp) {
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = recovery_clamp;
      auVar7._8_8_ = recovery_clamp;
      auVar7._0_8_ = recovery_clamp;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar5 = vxorpd_avx512vl(auVar7,auVar1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_60;
      auVar1 = vmaxsd_avx(auVar9,auVar5);
      auVar11._8_8_ = auVar5._0_8_;
      auVar11._0_8_ = auVar5._0_8_;
      auVar1 = vminsd_avx(auVar1,auVar2);
      local_60 = auVar1._0_8_;
      auVar10._0_8_ = c * this->m_cur_par2;
      auVar10._8_8_ = c * this->m_cur_dot;
      auVar1 = vmaxpd_avx(auVar10,auVar11);
      local_48._0_16_ = vminpd_avx(auVar1,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->m_cur_dist - this->m_dist) * c;
      auVar1 = vmaxsd_avx(auVar8,auVar5);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar6 = auVar1._0_8_;
    }
    else {
      local_48._8_8_ = c * this->m_cur_dot;
      local_48._0_8_ = c * this->m_cur_par2;
      dVar6 = (this->m_cur_dist - this->m_dist) * c;
    }
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)off_L);
    *pSVar4 = local_60 + *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 1));
    *pSVar4 = (double)local_48._0_8_ + *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 2));
    auVar1 = vpermilpd_avx(local_48._0_16_,1);
    *pSVar4 = auVar1._0_8_ + *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 3));
    *pSVar4 = dVar6 + *pSVar4;
  }
  return;
}

Assistant:

void ChLinkRevoluteTranslational::IntLoadConstraint_C(const unsigned int off_L,
                                                      ChVectorDynamic<>& Qc,   
                                                      const double c,          
                                                      bool do_clamp,           
                                                      double recovery_clamp    
                                                      ) {
    if (!IsActive())
        return;

    double cnstr_par1_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par1, -recovery_clamp), recovery_clamp) : c * m_cur_par1;
    double cnstr_par2_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par2, -recovery_clamp), recovery_clamp) : c * m_cur_par2;
    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_dot, -recovery_clamp), recovery_clamp) : c * m_cur_dot;
    double cnstr_dist_violation =
        do_clamp ? ChMin(ChMax(c * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp) : c * (m_cur_dist - m_dist);

    Qc(off_L + 0) += cnstr_par1_violation;
    Qc(off_L + 1) += cnstr_par2_violation;
    Qc(off_L + 2) += cnstr_dot_violation;
    Qc(off_L + 3) += cnstr_dist_violation;
}